

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O1

int convertCompoundSelectToSubquery(Walker *pWalker,Select *p)

{
  Select **ppSVar1;
  uint uVar2;
  Parse *pParse;
  sqlite3 *db;
  uint uVar3;
  ulong uVar4;
  Select *pSVar5;
  SrcList *pSVar6;
  Expr *pExpr;
  ExprList *pEVar7;
  uint uVar8;
  long lVar9;
  ExprList_item *pEVar10;
  int iVar11;
  Select *pSVar12;
  Select *pSVar13;
  byte bVar14;
  Token dummy;
  Token local_58;
  Token local_40;
  
  bVar14 = 0;
  iVar11 = 0;
  if (p->pPrior == (Select *)0x0) {
    return 0;
  }
  pEVar7 = p->pOrderBy;
  pSVar5 = p;
  if (p == (Select *)0x0 || pEVar7 == (ExprList *)0x0) {
    return 0;
  }
  while ((pSVar5->op == 't' || (pSVar5->op == 'q'))) {
    ppSVar1 = &pSVar5->pPrior;
    pSVar5 = *ppSVar1;
    if (*ppSVar1 == (Select *)0x0) {
      return 0;
    }
  }
  uVar2 = pEVar7->nExpr;
  uVar4 = (ulong)uVar2;
  pEVar10 = pEVar7->a + uVar4;
  do {
    pEVar10 = pEVar10 + -1;
    uVar3 = (uint)uVar4;
    uVar8 = (int)uVar2 >> 0x1f & uVar2;
    if ((int)uVar3 < 1) break;
    uVar4 = (ulong)(uVar3 - 1);
    uVar8 = uVar3;
  } while ((pEVar10->pExpr->flags & 0x100) == 0);
  if (0 < (int)uVar8) {
    pParse = pWalker->pParse;
    db = pParse->db;
    pSVar5 = (Select *)sqlite3DbMallocRaw(db,0x78);
    iVar11 = 2;
    if (pSVar5 != (Select *)0x0) {
      pSVar5->pRightmost = (Select *)0x0;
      pSVar5->pLimit = (Expr *)0x0;
      pSVar5->pPrior = (Select *)0x0;
      pSVar5->pNext = (Select *)0x0;
      pSVar5->pHaving = (Expr *)0x0;
      pSVar5->pOrderBy = (ExprList *)0x0;
      pSVar5->pWhere = (Expr *)0x0;
      pSVar5->pGroupBy = (ExprList *)0x0;
      pSVar5->nSelectRow = 0.0;
      pSVar5->pSrc = (SrcList *)0x0;
      pSVar5->iOffset = 0;
      pSVar5->addrOpenEphm[0] = 0;
      pSVar5->addrOpenEphm[1] = 0;
      pSVar5->addrOpenEphm[2] = 0;
      pSVar5->pEList = (ExprList *)0x0;
      pSVar5->op = '\0';
      pSVar5->field_0x9 = 0;
      pSVar5->selFlags = 0;
      pSVar5->iLimit = 0;
      pSVar5->pOffset = (Expr *)0x0;
      local_58.z = (char *)0x0;
      local_58.n = 0;
      local_58._12_4_ = 0;
      pSVar6 = sqlite3SrcListAppendFromTerm
                         (pParse,(SrcList *)0x0,(Token *)0x0,(Token *)0x0,&local_58,pSVar5,
                          (Expr *)0x0,(IdList *)0x0);
      if (pSVar6 != (SrcList *)0x0) {
        pSVar12 = p;
        pSVar13 = pSVar5;
        for (lVar9 = 0xf; lVar9 != 0; lVar9 = lVar9 + -1) {
          pSVar13->pEList = pSVar12->pEList;
          pSVar12 = (Select *)((long)pSVar12 + (ulong)bVar14 * -0x10 + 8);
          pSVar13 = (Select *)((long)pSVar13 + (ulong)bVar14 * -0x10 + 8);
        }
        p->pSrc = pSVar6;
        local_40.z = (char *)0x0;
        local_40.n = 0;
        pExpr = sqlite3ExprAlloc(db,0x71,&local_40,0);
        pEVar7 = sqlite3ExprListAppend(pParse,(ExprList *)0x0,pExpr);
        p->pEList = pEVar7;
        p->op = 't';
        p->pWhere = (Expr *)0x0;
        pSVar5->pGroupBy = (ExprList *)0x0;
        pSVar5->pHaving = (Expr *)0x0;
        pSVar5->pOrderBy = (ExprList *)0x0;
        p->pPrior = (Select *)0x0;
        pSVar5->pLimit = (Expr *)0x0;
        pSVar5->pOffset = (Expr *)0x0;
        iVar11 = 0;
      }
    }
  }
  return iVar11;
}

Assistant:

static int convertCompoundSelectToSubquery(Walker *pWalker, Select *p){
  int i;
  Select *pNew;
  Select *pX;
  sqlite3 *db;
  struct ExprList_item *a;
  SrcList *pNewSrc;
  Parse *pParse;
  Token dummy;

  if( p->pPrior==0 ) return WRC_Continue;
  if( p->pOrderBy==0 ) return WRC_Continue;
  for(pX=p; pX && (pX->op==TK_ALL || pX->op==TK_SELECT); pX=pX->pPrior){}
  if( pX==0 ) return WRC_Continue;
  a = p->pOrderBy->a;
  for(i=p->pOrderBy->nExpr-1; i>=0; i--){
    if( a[i].pExpr->flags & EP_Collate ) break;
  }
  if( i<0 ) return WRC_Continue;

  /* If we reach this point, that means the transformation is required. */

  pParse = pWalker->pParse;
  db = pParse->db;
  pNew = sqlite3DbMallocZero(db, sizeof(*pNew) );
  if( pNew==0 ) return WRC_Abort;
  memset(&dummy, 0, sizeof(dummy));
  pNewSrc = sqlite3SrcListAppendFromTerm(pParse,0,0,0,&dummy,pNew,0,0);
  if( pNewSrc==0 ) return WRC_Abort;
  *pNew = *p;
  p->pSrc = pNewSrc;
  p->pEList = sqlite3ExprListAppend(pParse, 0, sqlite3Expr(db, TK_ALL, 0));
  p->op = TK_SELECT;
  p->pWhere = 0;
  pNew->pGroupBy = 0;
  pNew->pHaving = 0;
  pNew->pOrderBy = 0;
  p->pPrior = 0;
  pNew->pLimit = 0;
  pNew->pOffset = 0;
  return WRC_Continue;
}